

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool isDecoderForEncoding(QStringDecoder *dec,Encoding enc)

{
  long lVar1;
  bool bVar2;
  undefined4 in_ESI;
  QStringConverter *in_RDI;
  long in_FS_OFFSET;
  QAnyStringView nameView;
  QAnyStringView *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QStringConverter::isValid(in_RDI);
  if (bVar2) {
    QStringConverter::name(in_RDI);
    QAnyStringView::QAnyStringView<const_char_*,_true>
              ((QAnyStringView *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (char **)in_RDI);
    bVar2 = QAnyStringView::empty((QAnyStringView *)0x652583);
    uVar3 = false;
    if (!bVar2) {
      QStringConverter::nameForEncoding((Encoding)((ulong)in_RDI >> 0x20));
      QAnyStringView::QAnyStringView<const_char_*,_true>
                ((QAnyStringView *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 (char **)in_RDI);
      uVar3 = operator==((QAnyStringView *)
                         CONCAT44(in_ESI,CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffffb2,
                                                                 in_stack_ffffffffffffffb0))),
                         in_stack_ffffffffffffffa8);
    }
  }
  else {
    uVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

static bool isDecoderForEncoding(const QStringDecoder &dec, QStringDecoder::Encoding enc)
{
    if (!dec.isValid())
        return false;

    const QAnyStringView nameView{dec.name()};
    return !nameView.empty() && nameView == QStringDecoder::nameForEncoding(enc);
}